

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,CaseDef_conflict *caseDef)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TextureFormat TVar4;
  char *pcVar5;
  ostream *poVar6;
  ProgramSources *pPVar7;
  char *pcVar8;
  allocator<char> local_3c1;
  string colorFormat;
  undefined1 local_3a0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string colorInteger;
  ostringstream src;
  ostringstream colorValue;
  string local_198 [368];
  
  TVar4 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar3 = tcu::getNumUsedChannels(TVar4.order);
  bVar1 = ::vk::isUintFormat(caseDef->colorFormat);
  bVar2 = ::vk::isIntFormat(caseDef->colorFormat);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar6 = std::operator<<((ostream *)&src,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) in  vec4 in_position;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 1) in  vec4 in_color;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) out vec4 out_color;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"out gl_PerVertex {\n");
  poVar6 = std::operator<<(poVar6,"\tvec4 gl_Position;\n");
  poVar6 = std::operator<<(poVar6,"};\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"void main(void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"\tgl_Position\t= in_position;\n");
  poVar6 = std::operator<<(poVar6,"\tout_color\t= in_color;\n");
  std::operator<<(poVar6,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3a0,"vert",(allocator<char> *)&colorInteger);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_3a0);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)&colorValue,&colorFormat);
  glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)&colorValue);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string((string *)&colorFormat);
  std::__cxx11::string::~string((string *)local_3a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorValue);
  std::ostream::operator<<((ostringstream *)&colorValue,0x7d);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  if (iVar3 == 1) {
    pcVar5 = "float";
    if (bVar2) {
      pcVar5 = "int";
    }
    pcVar8 = "uint";
    if (!bVar1) {
      pcVar8 = pcVar5;
    }
    std::operator<<((ostream *)&src,pcVar8);
  }
  else {
    pcVar5 = "";
    if (bVar2) {
      pcVar5 = "i";
    }
    pcVar8 = "u";
    if (!bVar1) {
      pcVar8 = pcVar5;
    }
    poVar6 = std::operator<<((ostream *)&src,pcVar8);
    poVar6 = std::operator<<(poVar6,"vec");
    std::ostream::operator<<(poVar6,iVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  if (bVar1 || bVar2) {
    std::operator+(&local_358," * ",&colorFormat);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                   &local_358,"(");
    std::__cxx11::stringbuf::str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                   &local_378);
    std::operator+(&colorInteger,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,")");
    std::__cxx11::string::~string((string *)&src);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)local_3a0);
    std::__cxx11::string::~string((string *)&local_358);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorInteger,"",(allocator<char> *)&src);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar6 = std::operator<<((ostream *)&src,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) in  vec4 in_color;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) out ");
  poVar6 = std::operator<<(poVar6,(string *)&colorFormat);
  poVar6 = std::operator<<(poVar6," o_color;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"void main(void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"    o_color = ");
  poVar6 = std::operator<<(poVar6,(string *)&colorFormat);
  poVar6 = std::operator<<(poVar6,"(");
  if (iVar3 == 1) {
    pcVar5 = "in_color.r";
  }
  else if (iVar3 == 2) {
    pcVar5 = "in_color.rg";
  }
  else {
    pcVar5 = "in_color";
    if (iVar3 == 3) {
      pcVar5 = "in_color.rgb";
    }
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6,(string *)&colorInteger);
  poVar6 = std::operator<<(poVar6,");\n");
  std::operator<<(poVar6,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"frag",&local_3c1);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_358);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_3a0,&local_378);
  glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)local_3a0);
  std::__cxx11::string::~string((string *)(local_3a0 + 8));
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::~string((string *)&colorInteger);
  std::__cxx11::string::~string((string *)&colorFormat);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorValue);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	const int	numComponents	= getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
	const bool	isUint			= isUintFormat(caseDef.colorFormat);
	const bool	isSint			= isIntFormat(caseDef.colorFormat);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "	vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "	gl_Position	= in_position;\n"
			<< "	out_color	= in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream colorValue;
		colorValue << REFERENCE_COLOR_VALUE;
		const std::string colorFormat	= getColorFormatStr(numComponents, isUint, isSint);
		const std::string colorInteger	= (isUint || isSint ? " * "+colorFormat+"("+colorValue.str()+")" :"");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out " << colorFormat << " o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = " << colorFormat << "("
			<< (numComponents == 1 ? "in_color.r"   :
				numComponents == 2 ? "in_color.rg"  :
				numComponents == 3 ? "in_color.rgb" : "in_color")
			<< colorInteger
			<< ");\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}